

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

void __thiscall google::protobuf::Field::InternalSwap(Field *this,Field *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  ArenaStringPtr *pAVar2;
  bool bVar3;
  void *pvVar4;
  int iVar5;
  int32 iVar6;
  int32 iVar7;
  int iVar8;
  int iVar9;
  int32 iVar10;
  int32 iVar11;
  ulong uVar12;
  string *psVar13;
  UnknownFieldSet *other_00;
  Arena *pAVar14;
  Arena *arena;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar4 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) != 0) {
LAB_002f945f:
      other_00 = (UnknownFieldSet *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
      goto LAB_002f9467;
    }
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_002f945f;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
LAB_002f9467:
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
  }
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->options_).super_RepeatedPtrFieldBase,
             &(other->options_).super_RepeatedPtrFieldBase);
  pAVar1 = &this->name_;
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar12 = (ulong)arena & 1;
  pAVar14 = arena;
  if (uVar12 != 0) {
    pAVar14 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar2 = &other->name_;
  psVar13 = pAVar1->ptr_;
  if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar13 = pAVar1->ptr_;
      goto LAB_002f94d1;
    }
  }
  else {
LAB_002f94d1:
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar13);
    arena = (Arena *)this_00->ptr_;
    uVar12 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->type_url_;
  pAVar14 = arena;
  if (uVar12 != 0) {
    pAVar14 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar2 = &other->type_url_;
  psVar13 = pAVar1->ptr_;
  if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar13 = pAVar1->ptr_;
      goto LAB_002f9556;
    }
  }
  else {
LAB_002f9556:
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar13);
    arena = (Arena *)this_00->ptr_;
    uVar12 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->json_name_;
  pAVar14 = arena;
  if (uVar12 != 0) {
    pAVar14 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar2 = &other->json_name_;
  psVar13 = pAVar1->ptr_;
  if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar13 = pAVar1->ptr_;
      goto LAB_002f95d9;
    }
  }
  else {
LAB_002f95d9:
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar13);
    arena = (Arena *)this_00->ptr_;
    uVar12 = (ulong)((uint)arena & 1);
  }
  pAVar1 = &this->default_value_;
  if (uVar12 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pAVar2 = &other->default_value_;
  psVar13 = pAVar1->ptr_;
  if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_002f967c;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar13 = pAVar1->ptr_;
  }
  if (pAVar2->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar2,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar13);
LAB_002f967c:
  iVar8 = this->kind_;
  iVar9 = this->cardinality_;
  iVar10 = this->number_;
  iVar11 = this->oneof_index_;
  iVar5 = other->cardinality_;
  iVar6 = other->number_;
  iVar7 = other->oneof_index_;
  this->kind_ = other->kind_;
  this->cardinality_ = iVar5;
  this->number_ = iVar6;
  this->oneof_index_ = iVar7;
  other->kind_ = iVar8;
  other->cardinality_ = iVar9;
  other->number_ = iVar10;
  other->oneof_index_ = iVar11;
  bVar3 = this->packed_;
  this->packed_ = other->packed_;
  other->packed_ = bVar3;
  return;
}

Assistant:

void Field::InternalSwap(Field* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  options_.InternalSwap(&other->options_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  type_url_.Swap(&other->type_url_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  json_name_.Swap(&other->json_name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  default_value_.Swap(&other->default_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Field, packed_)
      + sizeof(Field::packed_)
      - PROTOBUF_FIELD_OFFSET(Field, kind_)>(
          reinterpret_cast<char*>(&kind_),
          reinterpret_cast<char*>(&other->kind_));
}